

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O0

void __thiscall
wasm::UnneededSetRemover::UnneededSetRemover
          (UnneededSetRemover *this,Function *func,PassOptions *passOptions,Module *module)

{
  undefined1 local_220 [8];
  UnneededSetRemover inner;
  undefined1 local_118 [8];
  LocalGetCounter counter;
  Module *module_local;
  PassOptions *passOptions_local;
  Function *func_local;
  UnneededSetRemover *this_local;
  
  counter.num.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)module;
  PostWalker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::PostWalker
            (&this->
              super_PostWalker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
            );
  this->passOptions = passOptions;
  this->localGetCounter = (LocalGetCounter *)0x0;
  this->module = (Module *)
                 counter.num.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  this->removed = false;
  this->refinalize = false;
  LocalGetCounter::LocalGetCounter((LocalGetCounter *)local_118,func);
  UnneededSetRemover((UnneededSetRemover *)local_220,(LocalGetCounter *)local_118,func,passOptions,
                     (Module *)
                     counter.num.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  this->removed = (bool)((byte)inner.module & 1);
  ~UnneededSetRemover((UnneededSetRemover *)local_220);
  LocalGetCounter::~LocalGetCounter((LocalGetCounter *)local_118);
  return;
}

Assistant:

UnneededSetRemover(Function* func, PassOptions& passOptions, Module& module)
    : passOptions(passOptions), module(module) {
    LocalGetCounter counter(func);
    UnneededSetRemover inner(counter, func, passOptions, module);
    removed = inner.removed;
  }